

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O2

int __thiscall section_data::unique_sort_intercepts(section_data *this)

{
  __normal_iterator<intercept_data_*,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>
  __first;
  _Base_ptr p_Var1;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>_>,_bool>
  pVar2;
  vector<intercept_data,_std::allocator<intercept_data>_> vec;
  value_type local_58;
  _Vector_base<intercept_data,_std::allocator<intercept_data>_> local_48;
  
  p_Var1 = (this->layer_intercepts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var1 == &(this->layer_intercepts)._M_t._M_impl.super__Rb_tree_header) {
      return 0;
    }
    std::vector<intercept_data,_std::allocator<intercept_data>_>::vector
              ((vector<intercept_data,_std::allocator<intercept_data>_> *)&local_48,
               (vector<intercept_data,_std::allocator<intercept_data>_> *)&p_Var1[1]._M_parent);
    local_58.x = this->x1;
    local_58.y = this->y1;
    local_58.dist = 0;
    std::vector<intercept_data,_std::allocator<intercept_data>_>::push_back
              ((vector<intercept_data,_std::allocator<intercept_data>_> *)&local_48,&local_58);
    local_58.x = this->x2;
    local_58.y = this->y2;
    local_58.dist = this->xsec_distance;
    std::vector<intercept_data,_std::allocator<intercept_data>_>::push_back
              ((vector<intercept_data,_std::allocator<intercept_data>_> *)&local_48,&local_58);
    std::
    __sort<__gnu_cxx::__normal_iterator<intercept_data*,std::vector<intercept_data,std::allocator<intercept_data>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (local_48._M_impl.super__Vector_impl_data._M_start,
               local_48._M_impl.super__Vector_impl_data._M_finish);
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<intercept_data*,std::vector<intercept_data,std::allocator<intercept_data>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (local_48._M_impl.super__Vector_impl_data._M_start,
                         local_48._M_impl.super__Vector_impl_data._M_finish);
    std::vector<intercept_data,_std::allocator<intercept_data>_>::erase
              ((vector<intercept_data,_std::allocator<intercept_data>_> *)&local_48,
               (const_iterator)__first._M_current,
               (const_iterator)local_48._M_impl.super__Vector_impl_data._M_finish);
    pVar2 = std::
            map<int,std::vector<intercept_data,std::allocator<intercept_data>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<intercept_data,std::allocator<intercept_data>>>>>
            ::insert_or_assign<std::vector<intercept_data,std::allocator<intercept_data>>&>
                      ((map<int,std::vector<intercept_data,std::allocator<intercept_data>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<intercept_data,std::allocator<intercept_data>>>>>
                        *)&this->layer_intercepts,(key_type *)(p_Var1 + 1),
                       (vector<intercept_data,_std::allocator<intercept_data>_> *)&local_48);
    if (pVar2.second != false) break;
    std::_Vector_base<intercept_data,_std::allocator<intercept_data>_>::~_Vector_base(&local_48);
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
  }
  __assert_fail("ins == false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HeinrichHerbst[P]Katana/katana_backend/src/section.cpp"
                ,0x353,"int section_data::unique_sort_intercepts()");
}

Assistant:

int section_data::unique_sort_intercepts()
{
  for (auto const &[key, val] : layer_intercepts)
  {
    auto vec = val;
    // add beginning and end points [boundary zone]
    intercept_data boxing_boundary;
    boxing_boundary.x = x1;
    boxing_boundary.y = y1;
    boxing_boundary.dist = 0;
    vec.push_back(boxing_boundary);
    boxing_boundary.x = x2;
    boxing_boundary.y = y2;
    boxing_boundary.dist = xsec_distance;
    vec.push_back(boxing_boundary);
    sort(vec.begin(), vec.end()); // must sort first
    vec.erase(unique(vec.begin(), vec.end()), vec.end());
    auto [it, ins] = layer_intercepts.insert_or_assign(key, vec);
    assert(ins == false);
  }
  return EXIT_SUCCESS;
}